

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_associative_containers.h
# Opt level: O0

vector<std::multiset<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::multiset<int,_std::less<int>,_std::allocator<int>_>_>_>
* testinator::anon_unknown_6::
  Arbitrary_Assoc<std::multiset<int,_std::less<int>,_std::allocator<int>_>_>::shrink
            (vector<std::multiset<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::multiset<int,_std::less<int>,_std::allocator<int>_>_>_>
             *__return_storage_ptr__,multiset<int,_std::less<int>,_std::allocator<int>_> *c)

{
  _Rb_tree_const_iterator<int> __first;
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  reference __x;
  iterator __last;
  reference this;
  iterator __i;
  insert_iterator<std::multiset<int,_std::less<int>,_std::allocator<int>_>_> __result;
  multiset<int,_std::less<int>,_std::allocator<int>_> local_c8;
  _Base_ptr local_90;
  _Base_ptr local_88;
  _Base_ptr local_80;
  size_type count;
  multiset<int,_std::less<int>,_std::allocator<int>_> local_68;
  _Rb_tree_const_iterator<int> local_30;
  iterator it;
  size_type l;
  multiset<int,_std::less<int>,_std::allocator<int>_> *c_local;
  vector<std::multiset<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::multiset<int,_std::less<int>,_std::allocator<int>_>_>_>
  *v;
  
  ::std::
  vector<std::multiset<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::multiset<int,_std::less<int>,_std::allocator<int>_>_>_>
  ::vector(__return_storage_ptr__);
  bVar1 = ::std::multiset<int,_std::less<int>,_std::allocator<int>_>::empty(c);
  if (!bVar1) {
    sVar2 = ::std::multiset<int,_std::less<int>,_std::allocator<int>_>::size(c);
    it._M_node = (_Base_ptr)(sVar2 >> 1);
    local_30._M_node =
         (_Base_ptr)::std::multiset<int,_std::less<int>,_std::allocator<int>_>::cbegin(c);
    local_68._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_68._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_68._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_68._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_68._M_t._M_impl._0_8_ = 0;
    local_68._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_68._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    ::std::multiset<int,_std::less<int>,_std::allocator<int>_>::multiset(&local_68);
    ::std::
    vector<std::multiset<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::multiset<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::push_back(__return_storage_ptr__,&local_68);
    ::std::multiset<int,_std::less<int>,_std::allocator<int>_>::~multiset(&local_68);
    local_80 = (_Base_ptr)0x0;
    while (local_80 < it._M_node) {
      pvVar3 = ::std::
               vector<std::multiset<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::multiset<int,_std::less<int>,_std::allocator<int>_>_>_>
               ::operator[](__return_storage_ptr__,0);
      __x = ::std::_Rb_tree_const_iterator<int>::operator*(&local_30);
      local_88 = (_Base_ptr)
                 ::std::multiset<int,_std::less<int>,_std::allocator<int>_>::insert(pvVar3,__x);
      local_80 = (_Base_ptr)((long)&local_80->_M_color + 1);
      local_90 = (_Base_ptr)::std::_Rb_tree_const_iterator<int>::operator++(&local_30,0);
    }
    if (it._M_node != (_Base_ptr)0x0) {
      local_c8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      local_c8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_c8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_c8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      local_c8._M_t._M_impl._0_8_ = 0;
      local_c8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_c8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      ::std::multiset<int,_std::less<int>,_std::allocator<int>_>::multiset(&local_c8);
      ::std::
      vector<std::multiset<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::multiset<int,_std::less<int>,_std::allocator<int>_>_>_>
      ::push_back(__return_storage_ptr__,&local_c8);
      ::std::multiset<int,_std::less<int>,_std::allocator<int>_>::~multiset(&local_c8);
      __first._M_node = local_30._M_node;
      __last = ::std::multiset<int,_std::less<int>,_std::allocator<int>_>::cend(c);
      pvVar3 = ::std::
               vector<std::multiset<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::multiset<int,_std::less<int>,_std::allocator<int>_>_>_>
               ::operator[](__return_storage_ptr__,1);
      this = ::std::
             vector<std::multiset<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::multiset<int,_std::less<int>,_std::allocator<int>_>_>_>
             ::operator[](__return_storage_ptr__,1);
      __i = ::std::multiset<int,_std::less<int>,_std::allocator<int>_>::begin(this);
      __result = ::std::inserter<std::multiset<int,std::less<int>,std::allocator<int>>>(pvVar3,__i);
      ::std::
      copy<std::_Rb_tree_const_iterator<int>,std::insert_iterator<std::multiset<int,std::less<int>,std::allocator<int>>>>
                (__first,(_Rb_tree_const_iterator<int>)__last._M_node,__result);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<C> shrink(const C& c)
      {
        std::vector<C> v;
        if (c.empty()) return v;
        auto l = c.size() / 2;
        auto it = c.cbegin();
        v.push_back(C());
        for (decltype(l) count = 0; count < l; count++, it++)
          v[0].insert(*it);
        if (l > 0)
        {
          v.push_back(C());
          copy(it, c.cend(), std::inserter(v[1], v[1].begin()));
        }
        return v;
      }